

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

bool glu::sl::isValid(ValueBlock *block)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  Value *pVVar5;
  undefined8 uVar6;
  ulong local_58;
  ValueBlock *local_50;
  ValueBlock *local_48;
  Value *value;
  size_t valNdx;
  size_t refArrayLen;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values;
  size_t storageNdx;
  ValueBlock *block_local;
  
  values = (vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)0x0;
  do {
    if ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)0x2 < values) {
      return true;
    }
    local_48 = block;
    if (values != (vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)0x0) {
      if (values == (vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)0x1) {
        local_50 = (ValueBlock *)&block->outputs;
      }
      else {
        local_50 = (ValueBlock *)&block->uniforms;
      }
      local_48 = local_50;
    }
    bVar1 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty(&local_48->inputs);
    if (bVar1) {
      local_58 = 0;
    }
    else {
      pvVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                         (&local_48->inputs,0);
      sVar4 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::size
                        (&pvVar3->elements);
      pvVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                         (&local_48->inputs,0);
      iVar2 = VarType::getScalarSize(&pvVar3->type);
      local_58 = sVar4 / (ulong)(long)iVar2;
    }
    for (value = (Value *)0x0;
        pVVar5 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                    (&local_48->inputs), value < pVVar5;
        value = (Value *)((long)&(value->type).m_type + 1)) {
      pvVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                         (&local_48->inputs,(size_type)value);
      bVar1 = VarType::isBasicType(&pvVar3->type);
      if (!bVar1) {
        uVar6 = std::__cxx11::string::c_str();
        tcu::print("ERROR: Value \'%s\' is of unsupported type!\n",uVar6);
        return false;
      }
      sVar4 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::size
                        (&pvVar3->elements);
      iVar2 = VarType::getScalarSize(&pvVar3->type);
      if (sVar4 != local_58 * (long)iVar2) {
        uVar6 = std::__cxx11::string::c_str();
        tcu::print("ERROR: Value \'%s\' has invalid number of scalars!\n",uVar6);
        return false;
      }
    }
    values = (vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
             ((long)&(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                     _M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

bool isValid (const ValueBlock& block)
{
	for (size_t storageNdx = 0; storageNdx < 3; ++storageNdx)
	{
		const vector<Value>&	values		= storageNdx == 0 ? block.inputs	:
											  storageNdx == 1 ? block.outputs	:
																block.uniforms;
		const size_t			refArrayLen	= values.empty() ? 0 : (values[0].elements.size() / (size_t)values[0].type.getScalarSize());

		for (size_t valNdx = 0; valNdx < values.size(); ++valNdx)
		{
			const Value&	value	= values[valNdx];

			if (!value.type.isBasicType())
			{
				print("ERROR: Value '%s' is of unsupported type!\n", value.name.c_str());
				return false;
			}

			if (value.elements.size() != refArrayLen*(size_t)value.type.getScalarSize())
			{
				print("ERROR: Value '%s' has invalid number of scalars!\n", value.name.c_str());
				return false;
			}
		}
	}

	return true;
}